

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

void Gia_ManHashResize(Gia_Man_t *p)

{
  int iVar1;
  int iLitC;
  int iVar2;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pThis0;
  Vec_Int_t vOld;
  int *pPlace;
  int local_20;
  int Counter2;
  int Counter;
  int iNext;
  int iThis;
  int i;
  Gia_Man_t *p_local;
  
  pThis0 = *(Gia_Obj_t **)&p->vHTable;
  vOld._0_8_ = (p->vHTable).pArray;
  iVar1 = Vec_IntSize((Vec_Int_t *)&pThis0);
  if (iVar1 < 1) {
    __assert_fail("Vec_IntSize(&vOld) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                  ,0xaa,"void Gia_ManHashResize(Gia_Man_t *)");
  }
  Vec_IntZero(&p->vHTable);
  iVar1 = Gia_ManAndNum(p);
  iVar1 = Abc_PrimeCudd(iVar1 << 1);
  Vec_IntFill(&p->vHTable,iVar1,0);
  local_20 = 0;
  iNext = 0;
  do {
    iVar1 = Vec_IntSize((Vec_Int_t *)&pThis0);
    if (iVar1 <= iNext) {
      iVar1 = Gia_ManAndNum(p);
      iVar2 = Gia_ManBufNum(p);
      if (local_20 != iVar1 - iVar2) {
        __assert_fail("Counter == Counter2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xbe,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      Vec_IntErase((Vec_Int_t *)&pThis0);
      return;
    }
    Counter = Vec_IntEntry((Vec_Int_t *)&pThis0,iNext);
    Counter2 = Vec_IntEntry(&p->vHash,Counter);
    while (Counter != 0) {
      pObj = Gia_ManObj(p,Counter);
      Vec_IntWriteEntry(&p->vHash,Counter,0);
      iVar1 = Gia_ObjFaninLit0(pObj,Counter);
      iVar2 = Gia_ObjFaninLit1(pObj,Counter);
      iLitC = Gia_ObjFaninLit2p(p,pObj);
      vOld.pArray = Gia_ManHashFind(p,iVar1,iVar2,iLitC);
      if (*vOld.pArray != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xb8,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      *vOld.pArray = Counter;
      if (*vOld.pArray == 0) {
        __assert_fail("*pPlace != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0xba,"void Gia_ManHashResize(Gia_Man_t *)");
      }
      local_20 = local_20 + 1;
      Counter = Counter2;
      Counter2 = Vec_IntEntry(&p->vHash,Counter2);
    }
    iNext = iNext + 1;
  } while( true );
}

Assistant:

void Gia_ManHashResize( Gia_Man_t * p )
{
    int i, iThis, iNext, Counter, Counter2, * pPlace;
    Vec_Int_t vOld = p->vHTable;
    assert( Vec_IntSize(&vOld) > 0 );
    // replace the table
    Vec_IntZero( &p->vHTable );
    Vec_IntFill( &p->vHTable, Abc_PrimeCudd( 2 * Gia_ManAndNum(p) ), 0 ); 
    // rehash the entries from the old table
    Counter = 0;
    Vec_IntForEachEntry( &vOld, iThis, i )
        for ( iNext = Vec_IntEntry(&p->vHash, iThis);  
              iThis;  iThis = iNext,   
              iNext = Vec_IntEntry(&p->vHash, iThis)  )
        {
            Gia_Obj_t * pThis0 = Gia_ManObj( p, iThis );
            Vec_IntWriteEntry( &p->vHash, iThis, 0 );
            pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pThis0, iThis), Gia_ObjFaninLit1(pThis0, iThis), Gia_ObjFaninLit2p(p, pThis0) );
            assert( *pPlace == 0 ); // should not be there
            *pPlace = iThis;
            assert( *pPlace != 0 );
            Counter++;
        }
    Counter2 = Gia_ManAndNum(p) - Gia_ManBufNum(p);
    assert( Counter == Counter2 );
//    if ( p->fVerbose )
//        printf( "Resizing GIA hash table: %d -> %d.\n", Vec_IntSize(&vOld), Vec_IntSize(&p->vHTable) );
    Vec_IntErase( &vOld );
}